

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O3

bool __thiscall draco::PointCloudEncoder::RearrangeAttributesEncoders(PointCloudEncoder *this)

{
  uint uVar1;
  undefined4 uVar2;
  AttributesEncoder *pAVar3;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  pointer puVar9;
  ulong uVar10;
  _Bit_type *p_Var11;
  pointer puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int ap;
  int iVar20;
  uint uVar21;
  int p;
  uint uVar22;
  vector<int,_std::allocator<int>_> attribute_encoding_order;
  allocator_type local_e2;
  bool local_e1;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> *local_98;
  ulong local_90;
  ulong local_88;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_98 = &this->attributes_encoder_ids_order_;
  std::vector<int,_std::allocator<int>_>::resize
            (local_98,(long)(this->attributes_encoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->attributes_encoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_80,
             (allocator_type *)&local_b8);
  puVar9 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this->attributes_encoders_).
            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = 0;
  do {
    uVar14 = (long)puVar12 - (long)puVar9 >> 3;
    if (uVar14 <= uVar10) {
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e1 = false;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_80,
                 (long)(int)((ulong)((long)(this->point_cloud_->attributes_).
                                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->point_cloud_->attributes_).
                                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_e1
                 ,&local_e2);
      puVar12 = (this->attributes_encoders_).
                super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar16 = true;
      if (puVar9 != puVar12) {
        uVar10 = 0;
        do {
          iVar20 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
          pAVar3 = puVar12[iVar20]._M_t.
                   super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                   .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
          uVar14 = (ulong)((long)(pAVar3->point_attribute_ids_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          *(long *)&(pAVar3->point_attribute_ids_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl) >> 2;
          uVar22 = (uint)uVar14;
          if (1 < (int)uVar22) {
            local_90 = uVar10;
            std::vector<int,_std::allocator<int>_>::resize(&local_b8,(ulong)(uVar22 & 0x7fffffff));
            uVar15 = (ulong)(uVar22 & 0x7fffffff);
            uVar10 = 0;
            local_d0 = uVar15;
            local_88 = uVar14;
            while ((int)uVar10 < (int)local_88) {
              uVar14 = 0;
              local_e0 = 0;
              p_Var11 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              local_d8 = uVar10;
              do {
                uVar10 = uVar14 >> 6 & 0x3ffffff;
                if ((p_Var11[uVar10] >> (uVar14 & 0x3f) & 1) == 0) {
                  uVar2 = *(undefined4 *)
                           (*(long *)((long)(this->attributes_encoders_).
                                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar20]._M_t.
                                            super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                            ._M_t + 8) + uVar14 * 4);
                  iVar5 = 0;
                  local_c8 = uVar10;
                  local_c0 = 1L << ((byte)uVar14 & 0x3f);
                  do {
                    _Var4._M_t.
                    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                         (this->attributes_encoders_).
                         super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar20]._M_t.
                         super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                         ._M_t;
                    iVar7 = (**(code **)(*(long *)_Var4._M_t.
                                                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                                  .
                                                  super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                                  ._M_head_impl + 0x30))
                                      (_Var4._M_t.
                                       super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                       .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                       _M_head_impl,uVar2);
                    if (iVar7 <= iVar5) {
                      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)local_d8] = (int)uVar14;
                      local_d8 = (ulong)((int)local_d8 + 1);
                      local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_c8] =
                           local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_c8]
                           | local_c0;
                      local_e0 = CONCAT71((int7)(local_c0 >> 8),1);
                      p_Var11 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                      uVar15 = local_d0;
                      break;
                    }
                    _Var4._M_t.
                    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                         (this->attributes_encoders_).
                         super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar20]._M_t.
                         super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                         ._M_t;
                    iVar8 = (**(code **)(*(long *)_Var4._M_t.
                                                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                                  .
                                                  super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                                  ._M_head_impl + 0x38))
                                      (_Var4._M_t.
                                       super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                       .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                       _M_head_impl,uVar2,iVar5);
                    iVar7 = iVar8 + 0x3f;
                    if (-1 < iVar8) {
                      iVar7 = iVar8;
                    }
                    iVar5 = iVar5 + 1;
                    p_Var11 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    uVar15 = local_d0;
                  } while ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [(long)(iVar7 >> 6) +
                             ((ulong)(((long)iVar8 & 0x800000000000003fU) < 0x8000000000000001) - 1)
                            ] >> ((long)iVar8 & 0x3fU) & 1) != 0);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar15);
              uVar10 = local_d8;
              if ((local_e0 & 1) == 0 && (int)local_d8 < (int)local_88) {
                bVar16 = false;
                goto LAB_001452f3;
              }
            }
            AttributesEncoder::SetAttributeIds
                      ((AttributesEncoder *)
                       (this->attributes_encoders_).
                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar20]._M_t.
                       super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                       ._M_t,&local_b8);
            puVar12 = (this->attributes_encoders_).
                      super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar9 = (this->attributes_encoders_).
                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar10 = local_90;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 < (ulong)((long)puVar9 - (long)puVar12 >> 3));
        bVar16 = true;
      }
LAB_001452f3:
      if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      }
      if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_0014532d;
    }
    uVar15 = 0;
    if (puVar12 == puVar9) {
      puVar12 = puVar9;
      uVar17 = 0;
    }
    else {
      local_e0 = 0;
      do {
        uVar22 = (uint)uVar15;
        uVar19 = 1L << ((byte)uVar15 & 0x3f);
        uVar17 = uVar15 >> 6;
        uVar14 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar17];
        if ((uVar14 >> (uVar15 & 0x3f) & 1) == 0) {
          pAVar3 = puVar9[uVar15]._M_t.
                   super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                   .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
          lVar13 = *(long *)&(pAVar3->point_attribute_ids_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl;
          uVar18 = uVar10;
          if ((int)((ulong)((long)(pAVar3->point_attribute_ids_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - lVar13) >> 2) != 0) {
            local_c8 = CONCAT44(local_c8._4_4_,(int)uVar10);
            local_c0 = CONCAT44(local_c0._4_4_,
                                (int)CONCAT71((int7)((ulong)local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p >> 8),1));
            uVar21 = 0;
            local_d8 = uVar17;
            local_d0 = uVar19;
            do {
              uVar1 = *(uint *)(lVar13 + (long)(int)uVar21 * 4);
              for (iVar20 = 0;
                  pAVar3 = puVar9[uVar15]._M_t.
                           super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                           .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
                  iVar5 = (*pAVar3->_vptr_AttributesEncoder[6])(pAVar3,(ulong)uVar1), iVar20 < iVar5
                  ; iVar20 = iVar20 + 1) {
                _Var4._M_t.
                super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                     (this->attributes_encoders_).
                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                     super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                     ._M_t;
                uVar6 = (**(code **)(*(long *)_Var4._M_t.
                                              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                              .
                                              super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                              ._M_head_impl + 0x38))
                                  (_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                   .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                   _M_head_impl,uVar1,iVar20);
                if (uVar6 != uVar22) {
                  iVar5 = (this->attribute_to_encoder_map_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6];
                  uVar10 = (ulong)iVar5;
                  iVar7 = iVar5 + 0x3f;
                  if (-1 < (long)uVar10) {
                    iVar7 = iVar5;
                  }
                  if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)(iVar7 >> 6) +
                        ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar10 & 0x3f) & 1) == 0) {
                    local_c0 = local_c0 & 0xffffffff00000000;
                    break;
                  }
                }
                puVar9 = (this->attributes_encoders_).
                         super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              }
              uVar21 = uVar21 + 1;
              puVar9 = (this->attributes_encoders_).
                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pAVar3 = puVar9[uVar15]._M_t.
                       super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                       .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
              lVar13 = *(long *)&(pAVar3->point_attribute_ids_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
            } while (uVar21 < (uint)((ulong)((long)(pAVar3->point_attribute_ids_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            lVar13) >> 2));
            if ((local_c0 & 1) == 0) {
              uVar10 = local_c8 & 0xffffffff;
              goto LAB_001450ab;
            }
            uVar14 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_d8];
            uVar18 = local_c8 & 0xffffffff;
            uVar17 = local_d8;
            uVar19 = local_d0;
          }
          (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar18] = uVar22;
          uVar10 = (ulong)((int)uVar18 + 1);
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar17] = uVar14 | uVar19;
          local_e0 = CONCAT71((int7)(uVar18 >> 8),1);
        }
LAB_001450ab:
        uVar15 = (ulong)(uVar22 + 1);
        puVar12 = (this->attributes_encoders_).
                  super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar14 = (long)puVar12 - (long)puVar9 >> 3;
        uVar17 = local_e0;
      } while (uVar15 < uVar14);
    }
  } while (((uVar17 & 1) != 0) || (uVar14 <= uVar10));
  bVar16 = false;
LAB_0014532d:
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar16;
}

Assistant:

bool PointCloudEncoder::RearrangeAttributesEncoders() {
  // Find the encoding order of the attribute encoders that is determined by
  // the parent dependencies between individual encoders. Instead of traversing
  // a graph we encode the attributes in multiple iterations where encoding of
  // attributes that depend on other attributes may get postponed until the
  // parent attributes are processed.
  // This is simpler to implement than graph traversal and it automatically
  // detects any cycles in the dependency graph.
  // TODO(ostava): Current implementation needs to encode all attributes of a
  // single encoder to be encoded in a single "chunk", therefore we need to sort
  // attribute encoders before we sort individual attributes. This requirement
  // can be lifted for encoders that can encode individual attributes separately
  // but it will require changes in the current API.
  attributes_encoder_ids_order_.resize(attributes_encoders_.size());
  std::vector<bool> is_encoder_processed(attributes_encoders_.size(), false);
  uint32_t num_processed_encoders = 0;
  while (num_processed_encoders < attributes_encoders_.size()) {
    // Flagged when any of the encoder get processed.
    bool encoder_processed = false;
    for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
      if (is_encoder_processed[i]) {
        continue;  // Encoder already processed.
      }
      // Check if all parent encoders are already processed.
      bool can_be_processed = true;
      for (uint32_t p = 0; p < attributes_encoders_[i]->num_attributes(); ++p) {
        const int32_t att_id = attributes_encoders_[i]->GetAttributeId(p);
        for (int ap = 0;
             ap < attributes_encoders_[i]->NumParentAttributes(att_id); ++ap) {
          const uint32_t parent_att_id =
              attributes_encoders_[i]->GetParentAttributeId(att_id, ap);
          const int32_t parent_encoder_id =
              attribute_to_encoder_map_[parent_att_id];
          if (parent_att_id != i && !is_encoder_processed[parent_encoder_id]) {
            can_be_processed = false;
            break;
          }
        }
      }
      if (!can_be_processed) {
        continue;  // Try to process the encoder in the next iteration.
      }
      // Encoder can be processed. Update the encoding order.
      attributes_encoder_ids_order_[num_processed_encoders++] = i;
      is_encoder_processed[i] = true;
      encoder_processed = true;
    }
    if (!encoder_processed &&
        num_processed_encoders < attributes_encoders_.size()) {
      // No encoder was processed but there are still some remaining unprocessed
      // encoders.
      return false;
    }
  }

  // Now for every encoder, reorder the attributes to satisfy their
  // dependencies (an attribute may still depend on other attributes within an
  // encoder).
  std::vector<int32_t> attribute_encoding_order;
  std::vector<bool> is_attribute_processed(point_cloud_->num_attributes(),
                                           false);
  int num_processed_attributes;
  for (uint32_t ae_order = 0; ae_order < attributes_encoders_.size();
       ++ae_order) {
    const int ae = attributes_encoder_ids_order_[ae_order];
    const int32_t num_encoder_attributes =
        attributes_encoders_[ae]->num_attributes();
    if (num_encoder_attributes < 2) {
      continue;  // No need to resolve dependencies for a single attribute.
    }
    num_processed_attributes = 0;
    attribute_encoding_order.resize(num_encoder_attributes);
    while (num_processed_attributes < num_encoder_attributes) {
      // Flagged when any of the attributes get processed.
      bool attribute_processed = false;
      for (int i = 0; i < num_encoder_attributes; ++i) {
        const int32_t att_id = attributes_encoders_[ae]->GetAttributeId(i);
        if (is_attribute_processed[i]) {
          continue;  // Attribute already processed.
        }
        // Check if all parent attributes are already processed.
        bool can_be_processed = true;
        for (int p = 0;
             p < attributes_encoders_[ae]->NumParentAttributes(att_id); ++p) {
          const int32_t parent_att_id =
              attributes_encoders_[ae]->GetParentAttributeId(att_id, p);
          if (!is_attribute_processed[parent_att_id]) {
            can_be_processed = false;
            break;
          }
        }
        if (!can_be_processed) {
          continue;  // Try to process the attribute in the next iteration.
        }
        // Attribute can be processed. Update the encoding order.
        attribute_encoding_order[num_processed_attributes++] = i;
        is_attribute_processed[i] = true;
        attribute_processed = true;
      }
      if (!attribute_processed &&
          num_processed_attributes < num_encoder_attributes) {
        // No attribute was processed but there are still some remaining
        // unprocessed attributes.
        return false;
      }
    }
    // Update the order of the attributes within the encoder.
    attributes_encoders_[ae]->SetAttributeIds(attribute_encoding_order);
  }
  return true;
}